

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay_estimator_wrapper.cc
# Opt level: O1

int WebRtc_DelayEstimatorProcessFloat(void *handle,float *near_spectrum,int spectrum_size)

{
  uint32_t binary_near_spectrum;
  int iVar1;
  
  if ((near_spectrum != (float *)0x0 && handle != (void *)0x0) &&
     (*(int *)((long)handle + 0xc) == spectrum_size)) {
    binary_near_spectrum = BinarySpectrumFloat(near_spectrum,*handle,(int *)((long)handle + 8));
    iVar1 = WebRtc_ProcessBinarySpectrum
                      (*(BinaryDelayEstimator **)((long)handle + 0x10),binary_near_spectrum);
    return iVar1;
  }
  return -1;
}

Assistant:

int WebRtc_DelayEstimatorProcessFloat(void* handle,
                                      const float* near_spectrum,
                                      int spectrum_size) {
  DelayEstimator* self = (DelayEstimator*) handle;
  uint32_t binary_spectrum = 0;

  if (self == NULL) {
    return -1;
  }
  if (near_spectrum == NULL) {
    // Empty near end spectrum.
    return -1;
  }
  if (spectrum_size != self->spectrum_size) {
    // Data sizes don't match.
    return -1;
  }

  // Get binary spectrum.
  binary_spectrum = BinarySpectrumFloat(near_spectrum, self->mean_near_spectrum,
                                        &(self->near_spectrum_initialized));

  return WebRtc_ProcessBinarySpectrum(self->binary_handle, binary_spectrum);
}